

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall
QWidgetPrivate::setLayoutDirection_helper(QWidgetPrivate *this,LayoutDirection direction)

{
  bool bVar1;
  uint uVar2;
  QWidget *pQVar3;
  QObject *o;
  qsizetype qVar4;
  QWidget *pQVar5;
  int in_ESI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  bool in_stack_00000013;
  WidgetAttribute in_stack_00000014;
  QWidget *w;
  int i;
  QWidget *q;
  QEvent e;
  undefined4 in_stack_ffffffffffffffb8;
  int local_34;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  uVar2 = (uint)(in_ESI == 1);
  bVar1 = QWidget::testAttribute
                    ((QWidget *)(ulong)CONCAT14(in_ESI == 1,in_stack_ffffffffffffffb8),
                     (WidgetAttribute)((ulong)in_RDI >> 0x20));
  if (uVar2 != bVar1) {
    QWidget::setAttribute(w,in_stack_00000014,in_stack_00000013);
    bVar1 = QList<QObject_*>::isEmpty((QList<QObject_*> *)0x36d763);
    if (!bVar1) {
      local_34 = 0;
      while( true ) {
        o = (QObject *)(long)local_34;
        qVar4 = QList<QObject_*>::size((QList<QObject_*> *)&in_RDI->field_0x18);
        if (qVar4 <= (long)o) break;
        QList<QObject_*>::at((QList<QObject_*> *)in_RDI,(qsizetype)o);
        pQVar5 = qobject_cast<QWidget*>(o);
        if (((pQVar5 != (QWidget *)0x0) && (bVar1 = QWidget::isWindow((QWidget *)in_RDI), !bVar1))
           && (bVar1 = QWidget::testAttribute
                                 ((QWidget *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),
                                  (WidgetAttribute)((ulong)in_RDI >> 0x20)), !bVar1)) {
          QWidget::d_func((QWidget *)0x36d7e9);
          setLayoutDirection_helper
                    ((QWidgetPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),
                     (LayoutDirection)((ulong)pQVar3 >> 0x20));
        }
        local_34 = local_34 + 1;
      }
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_18,LayoutDirectionChange);
    QCoreApplication::sendEvent(&pQVar3->super_QObject,(QEvent *)&local_18);
    QEvent::~QEvent((QEvent *)&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setLayoutDirection_helper(Qt::LayoutDirection direction)
{
    Q_Q(QWidget);

    if ( (direction == Qt::RightToLeft) == q->testAttribute(Qt::WA_RightToLeft))
        return;
    q->setAttribute(Qt::WA_RightToLeft, (direction == Qt::RightToLeft));
    if (!children.isEmpty()) {
        for (int i = 0; i < children.size(); ++i) {
            QWidget *w = qobject_cast<QWidget*>(children.at(i));
            if (w && !w->isWindow() && !w->testAttribute(Qt::WA_SetLayoutDirection))
                w->d_func()->setLayoutDirection_helper(direction);
        }
    }
    QEvent e(QEvent::LayoutDirectionChange);
    QCoreApplication::sendEvent(q, &e);
}